

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O3

void leopard::ff16::IFFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint64_t uVar12;
  long lVar13;
  ulong extraout_RDX;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  
  if (CpuHasAVX2 == '\x01') {
    auVar50[8] = 0xf;
    auVar50._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar50[9] = 0xf;
    auVar50[10] = 0xf;
    auVar50[0xb] = 0xf;
    auVar50[0xc] = 0xf;
    auVar50[0xd] = 0xf;
    auVar50[0xe] = 0xf;
    auVar50[0xf] = 0xf;
    auVar50[0x10] = 0xf;
    auVar50[0x11] = 0xf;
    auVar50[0x12] = 0xf;
    auVar50[0x13] = 0xf;
    auVar50[0x14] = 0xf;
    auVar50[0x15] = 0xf;
    auVar50[0x16] = 0xf;
    auVar50[0x17] = 0xf;
    auVar50[0x18] = 0xf;
    auVar50[0x19] = 0xf;
    auVar50[0x1a] = 0xf;
    auVar50[0x1b] = 0xf;
    auVar50[0x1c] = 0xf;
    auVar50[0x1d] = 0xf;
    auVar50[0x1e] = 0xf;
    auVar50[0x1f] = 0xf;
    lVar13 = (ulong)log_m * 0x100;
    auVar32 = *(undefined1 (*) [32])(Multiply256LUT + lVar13);
    auVar33 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + lVar13);
    auVar47 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + lVar13);
    auVar48 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + lVar13);
    auVar4 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + lVar13);
    auVar5 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + lVar13);
    auVar6 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + lVar13);
    auVar7 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + lVar13);
    uVar12 = 0;
    do {
      auVar30 = *(undefined1 (*) [32])((long)x + uVar12);
      auVar31 = *(undefined1 (*) [32])((long)x + uVar12 + 0x20);
      auVar11 = auVar30 ^ *(undefined1 (*) [32])((long)y + uVar12);
      auVar28 = auVar31 ^ *(undefined1 (*) [32])((long)y + uVar12 + 0x20);
      auVar52 = vpsrlq_avx2(auVar11,4);
      *(undefined1 (*) [32])((long)y + uVar12) = auVar11;
      auVar11 = vpand_avx2(auVar11,auVar50);
      *(undefined1 (*) [32])((long)y + uVar12 + 0x20) = auVar28;
      auVar26 = vpsrlq_avx512vl(auVar28,4);
      auVar28 = vpand_avx2(auVar28,auVar50);
      auVar52 = vpand_avx2(auVar52,auVar50);
      auVar29 = vpshufb_avx2(auVar32,auVar11);
      auVar27 = vpshufb_avx512vl(auVar47,auVar28);
      auVar11 = vpshufb_avx2(auVar4,auVar11);
      auVar28 = vpshufb_avx2(auVar6,auVar28);
      auVar10 = vpshufb_avx2(auVar33,auVar52);
      auVar52 = vpshufb_avx2(auVar5,auVar52);
      auVar52 = vpternlogq_avx512vl(auVar28,auVar52,auVar11,0x96);
      auVar28 = vpandq_avx512vl(auVar26,auVar50);
      auVar29 = vpternlogq_avx512vl(auVar27,auVar10,auVar29,0x96);
      auVar11 = vpshufb_avx2(auVar48,auVar28);
      auVar28 = vpshufb_avx2(auVar7,auVar28);
      auVar30 = vpternlogq_avx512vl(auVar11,auVar30,auVar29,0x96);
      auVar31 = vpternlogq_avx512vl(auVar28,auVar31,auVar52,0x96);
      *(undefined1 (*) [32])((long)x + uVar12) = auVar30;
      *(undefined1 (*) [32])((long)x + uVar12 + 0x20) = auVar31;
      uVar12 = uVar12 + 0x40;
    } while (bytes != uVar12);
  }
  else if (CpuHasSSSE3 == '\x01') {
    auVar49[8] = 0xf;
    auVar49._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar49[9] = 0xf;
    auVar49[10] = 0xf;
    auVar49[0xb] = 0xf;
    auVar49[0xc] = 0xf;
    auVar49[0xd] = 0xf;
    auVar49[0xe] = 0xf;
    auVar49[0xf] = 0xf;
    lVar13 = (ulong)log_m * 0x80;
    auVar1 = *(undefined1 (*) [16])(Multiply128LUT + lVar13);
    auVar21 = *(undefined1 (*) [16])(Multiply128LUT + 0x10 + lVar13);
    auVar22 = *(undefined1 (*) [16])(Multiply128LUT + 0x20 + lVar13);
    auVar23 = *(undefined1 (*) [16])(Multiply128LUT + 0x30 + lVar13);
    auVar24 = *(undefined1 (*) [16])(Multiply128LUT + 0x40 + lVar13);
    auVar25 = *(undefined1 (*) [16])(Multiply128LUT + 0x50 + lVar13);
    auVar2 = *(undefined1 (*) [16])(Multiply128LUT + 0x60 + lVar13);
    auVar3 = *(undefined1 (*) [16])(Multiply128LUT + 0x70 + lVar13);
    uVar12 = 0;
    do {
      auVar19 = *(undefined1 (*) [16])((long)x + uVar12 + 0x10);
      auVar20 = *(undefined1 (*) [16])((long)x + uVar12 + 0x30);
      auVar9 = auVar19 ^ *(undefined1 (*) [16])((long)y + uVar12 + 0x10);
      auVar17 = auVar20 ^ *(undefined1 (*) [16])((long)y + uVar12 + 0x30);
      auVar51 = vpsrlq_avx(auVar9,4);
      *(undefined1 (*) [16])((long)y + uVar12 + 0x10) = auVar9;
      auVar9 = vpand_avx(auVar9,auVar49);
      *(undefined1 (*) [16])((long)y + uVar12 + 0x30) = auVar17;
      auVar15 = vpsrlq_avx512vl(auVar17,4);
      auVar17 = vpand_avx(auVar17,auVar49);
      auVar51 = vpand_avx(auVar51,auVar49);
      auVar18 = vpshufb_avx(auVar1,auVar9);
      auVar16 = vpshufb_avx512vl(auVar22,auVar17);
      auVar9 = vpshufb_avx(auVar24,auVar9);
      auVar17 = vpshufb_avx(auVar2,auVar17);
      auVar8 = vpshufb_avx(auVar21,auVar51);
      auVar51 = vpshufb_avx(auVar25,auVar51);
      auVar51 = vpternlogq_avx512vl(auVar17,auVar51,auVar9,0x96);
      auVar17 = vpandq_avx512vl(auVar15,auVar49);
      auVar18 = vpternlogq_avx512vl(auVar16,auVar8,auVar18,0x96);
      auVar9 = vpshufb_avx(auVar23,auVar17);
      auVar17 = vpshufb_avx(auVar3,auVar17);
      auVar19 = vpternlogq_avx512vl(auVar9,auVar19,auVar18,0x96);
      auVar20 = vpternlogq_avx512vl(auVar17,auVar20,auVar51,0x96);
      *(undefined1 (*) [16])((long)x + uVar12 + 0x10) = auVar19;
      *(undefined1 (*) [16])((long)x + uVar12 + 0x30) = auVar20;
      auVar19 = *(undefined1 (*) [16])((long)x + uVar12);
      auVar20 = *(undefined1 (*) [16])((long)x + uVar12 + 0x20);
      auVar9 = auVar19 ^ *(undefined1 (*) [16])((long)y + uVar12);
      auVar17 = auVar20 ^ *(undefined1 (*) [16])((long)y + uVar12 + 0x20);
      auVar51 = vpsrlq_avx(auVar9,4);
      *(undefined1 (*) [16])((long)y + uVar12) = auVar9;
      auVar9 = vpand_avx(auVar9,auVar49);
      *(undefined1 (*) [16])((long)y + uVar12 + 0x20) = auVar17;
      auVar15 = vpsrlq_avx512vl(auVar17,4);
      auVar17 = vpand_avx(auVar17,auVar49);
      auVar51 = vpand_avx(auVar51,auVar49);
      auVar18 = vpshufb_avx(auVar1,auVar9);
      auVar16 = vpshufb_avx512vl(auVar22,auVar17);
      auVar9 = vpshufb_avx(auVar24,auVar9);
      auVar17 = vpshufb_avx(auVar2,auVar17);
      auVar8 = vpshufb_avx(auVar21,auVar51);
      auVar51 = vpshufb_avx(auVar25,auVar51);
      auVar51 = vpternlogq_avx512vl(auVar17,auVar51,auVar9,0x96);
      auVar17 = vpandq_avx512vl(auVar15,auVar49);
      auVar18 = vpternlogq_avx512vl(auVar16,auVar8,auVar18,0x96);
      auVar9 = vpshufb_avx(auVar23,auVar17);
      auVar17 = vpshufb_avx(auVar3,auVar17);
      auVar19 = vpternlogq_avx512vl(auVar9,auVar19,auVar18,0x96);
      auVar20 = vpternlogq_avx512vl(auVar17,auVar20,auVar51,0x96);
      *(undefined1 (*) [16])((long)x + uVar12) = auVar19;
      *(undefined1 (*) [16])((long)x + uVar12 + 0x20) = auVar20;
      uVar12 = uVar12 + 0x40;
    } while (bytes != uVar12);
  }
  else {
    xor_mem(y,x,bytes);
    auVar34 = vpbroadcastd_avx512f(ZEXT416(0xf));
    auVar35 = vpbroadcastd_avx512f(ZEXT416(0x10));
    auVar36 = vpbroadcastd_avx512f(ZEXT416(0x20));
    auVar37 = vpbroadcastd_avx512f(ZEXT416(0x30));
    uVar12 = 0;
    lVar13 = (ulong)log_m * 0x80 + Multiply16LUT;
    uVar14 = extraout_RDX;
    do {
      auVar38 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x20));
      auVar39 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12));
      auVar40 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x60));
      auVar41 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar12 + 0x40));
      auVar42 = vmovdqa64_avx512f(auVar36);
      auVar43 = vpandd_avx512f(auVar38,auVar34);
      auVar44 = vpandd_avx512f(auVar39,auVar34);
      auVar38 = vpsrld_avx512f(auVar38,4);
      auVar39 = vpsrld_avx512f(auVar39,4);
      auVar42 = vpternlogd_avx512f(auVar42,auVar41,auVar34,0xf8);
      auVar41 = vpsrld_avx512f(auVar41,4);
      auVar32 = vextracti64x4_avx512f(auVar43,1);
      auVar43 = vpmovzxdq_avx512f(auVar43._0_32_);
      auVar33 = vextracti64x4_avx512f(auVar44,1);
      auVar44 = vpmovzxdq_avx512f(auVar44._0_32_);
      auVar41 = vpord_avx512f(auVar41,auVar37);
      auVar45 = vpmovzxdq_avx512f(auVar32);
      auVar46 = vpmovzxdq_avx512f(auVar33);
      auVar1 = vpinsrw_avx(ZEXT216(*(ushort *)
                                    (lVar13 + CONCAT44((int)(uVar14 >> 0x20),auVar45._0_4_) * 2)),
                           (uint)*(ushort *)(lVar13 + (ulong)auVar45._8_4_ * 2),1);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar45._16_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar45,2);
      auVar22 = vextracti32x4_avx512f(auVar45,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar45._24_4_ * 2),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar43._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar43._8_4_ * 2),1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar43._16_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar43,2);
      auVar23 = vextracti32x4_avx512f(auVar43,3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar43._24_4_ * 2),3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),6);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),7);
      auVar22 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar46._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar46._8_4_ * 2),1);
      auVar33._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21;
      auVar33._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar46._16_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar46,2);
      auVar22 = vextracti32x4_avx512f(auVar46,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar46._24_4_ * 2),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar44._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar44._8_4_ * 2),1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar44._16_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar44,2);
      auVar23 = vextracti32x4_avx512f(auVar44,3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar44._24_4_ * 2),3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar39 = vpord_avx512f(auVar39,auVar35);
      auVar38 = vpord_avx512f(auVar38,auVar35);
      auVar32 = vextracti64x4_avx512f(auVar38,1);
      auVar38 = vpmovzxdq_avx512f(auVar38._0_32_);
      auVar43 = vpmovzxdq_avx512f(auVar32);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),6);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),7);
      auVar32 = vextracti64x4_avx512f(auVar39,1);
      auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
      auVar44 = vpmovzxdq_avx512f(auVar32);
      auVar22 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar43._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar43._8_4_ * 2),1);
      auVar45 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                               ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21)),auVar33,
                           1);
      auVar1 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar43._16_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar43,2);
      auVar22 = vextracti32x4_avx512f(auVar43,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar43._24_4_ * 2),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar38._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar38._8_4_ * 2),1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar38._16_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar38,2);
      auVar23 = vextracti32x4_avx512f(auVar38,3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar38._24_4_ * 2),3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),6);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),7);
      auVar22 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar44._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar44._8_4_ * 2),1);
      auVar47._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21;
      auVar47._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar44._16_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar44,2);
      auVar22 = vextracti32x4_avx512f(auVar44,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar44._24_4_ * 2),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar39._0_4_ * 2)),
                            (uint)*(ushort *)(lVar13 + (ulong)auVar39._8_4_ * 2),1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar39._16_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar39,2);
      auVar23 = vextracti32x4_avx512f(auVar39,3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar39._24_4_ * 2),3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar38 = vmovdqa64_avx512f(auVar36);
      auVar38 = vpternlogd_avx512f(auVar38,auVar40,auVar34,0xf8);
      auVar39 = vpsrld_avx512f(auVar40,4);
      auVar32 = vextracti64x4_avx512f(auVar38,1);
      auVar38 = vpmovzxdq_avx512f(auVar38._0_32_);
      auVar39 = vpord_avx512f(auVar39,auVar37);
      auVar33 = vextracti64x4_avx512f(auVar39,1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),6);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),7);
      auVar40 = vpmovzxdq_avx512f(auVar32);
      auVar32 = vextracti64x4_avx512f(auVar42,1);
      auVar42 = vpmovzxdq_avx512f(auVar42._0_32_);
      auVar43 = vpmovzxdq_avx512f(auVar32);
      auVar22 = vextracti32x4_avx512vl(auVar40._0_32_,1);
      auVar44 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                               ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21)),auVar47,
                           1);
      auVar44 = vpxorq_avx512f(auVar44,auVar45);
      auVar1 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar40._0_4_ * 2)),
                                (uint)*(ushort *)(lVar13 + (ulong)auVar40._8_4_ * 2),1);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar40,2);
      auVar23 = vextracti32x4_avx512f(auVar40,3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar22 = vextracti32x4_avx512vl(auVar38._0_32_,1);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),6);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),7);
      auVar21 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar38._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar38._8_4_ * 2),1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),2);
      auVar23 = vextracti32x4_avx512f(auVar38,2);
      auVar24 = vextracti32x4_avx512f(auVar38,3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),4);
      auVar25 = vextracti32x4_avx512vl(auVar43._0_32_,1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),5);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._0_4_ * 2),6);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._8_4_ * 2),7);
      auVar22 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar43._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar43._8_4_ * 2),1);
      auVar48._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21;
      auVar48._16_16_ = ZEXT116(1) * auVar1;
      auVar1 = vpinsrw_avx512bw(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar25._0_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar43,2);
      auVar22 = vextracti32x4_avx512f(auVar43,3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar25._8_4_ * 2),3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar23 = vextracti32x4_avx512vl(auVar42._0_32_,1);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar42._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar42._8_4_ * 2),1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar42,2);
      auVar24 = vextracti32x4_avx512f(auVar42,3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar38 = vpmovzxdq_avx512f(auVar33);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar23 = vextracti32x4_avx512vl(auVar38._0_32_,1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._0_4_ * 2),6);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._8_4_ * 2),7);
      auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
      auVar32 = vextracti64x4_avx512f(auVar41,1);
      auVar40 = vpmovzxdq_avx512f(auVar32);
      auVar41 = vpmovzxdq_avx512f(auVar41._0_32_);
      auVar22 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar38._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar38._8_4_ * 2),1);
      auVar32 = vinserti32x4_avx512vl(ZEXT1632(auVar21),auVar1,1);
      auVar42 = vinserti64x4_avx512f(ZEXT3264(auVar32),auVar48,1);
      auVar1 = vpinsrw_avx512bw(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar38,2);
      auVar22 = vextracti32x4_avx512f(auVar38,3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar23 = vextracti32x4_avx512vl(auVar39._0_32_,1);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar39._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar39._8_4_ * 2),1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar39,2);
      auVar24 = vextracti32x4_avx512f(auVar39,3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar23 = vextracti32x4_avx512vl(auVar40._0_32_,1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._0_4_ * 2),6);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._8_4_ * 2),7);
      auVar22 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar40._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar40._8_4_ * 2),1);
      auVar32 = vinserti32x4_avx512vl(ZEXT1632(auVar21),auVar1,1);
      auVar1 = vpinsrw_avx512bw(auVar22,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar40,2);
      auVar22 = vextracti32x4_avx512f(auVar40,3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._0_4_ * 2),4);
      auVar23 = vextracti32x4_avx512vl(auVar41._0_32_,1);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar21._8_4_ * 2),5);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),6);
      auVar1 = vpinsrw_avx512bw(auVar1,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),7);
      auVar21 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar13 + (ulong)auVar41._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar13 + (ulong)auVar41._8_4_ * 2),1);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._0_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar41,2);
      auVar24 = vextracti32x4_avx512f(auVar41,3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar23._8_4_ * 2),3);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._0_4_ * 2),4);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + (ulong)auVar24._0_4_ * 2),6);
      uVar14 = (ulong)auVar24._8_4_;
      auVar21 = vpinsrw_avx512bw(auVar21,(uint)*(ushort *)(lVar13 + uVar14 * 2),7);
      auVar38 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar1,
                                               ZEXT116(0) * auVar1 + ZEXT116(1) * auVar21)),auVar32,
                           1);
      auVar38 = vpternlogq_avx512f(auVar38,auVar44,auVar42,0x96);
      auVar32 = vpmovwb_avx512bw(auVar38);
      *(undefined1 (*) [32])((long)x + uVar12) = auVar32 ^ *(undefined1 (*) [32])((long)x + uVar12);
      auVar38 = vpsrlw_avx512bw(auVar38,8);
      auVar32 = vpmovwb_avx512bw(auVar38);
      *(undefined1 (*) [32])((long)x + uVar12 + 0x20) =
           auVar32 ^ *(undefined1 (*) [32])((long)x + uVar12 + 0x20);
      uVar12 = uVar12 + 0x40;
    } while (bytes != uVar12);
  }
  return;
}

Assistant:

static void IFFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_IFFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); }

            LEO_IFFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_IFFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); }

            LEO_IFFTB_128(x16 + 1, y16 + 1);
            LEO_IFFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    xor_mem(y, x, bytes);
    RefMulAdd(x, y, log_m, bytes);
}